

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

void gimage::loadViewProperties(Properties *prop,char *name,char *spath,bool verbose)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  double *pdVar8;
  byte in_CL;
  char *in_RSI;
  IOException *anon_var_0_1;
  Exception *ex;
  Vector3d T;
  double t;
  Matrix33d A;
  Properties mprop;
  string s;
  size_t pos;
  Exception *anon_var_0;
  int k;
  int i_1;
  char *suffix [4];
  string depthname;
  size_t i;
  bool expl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  char *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  char in_stack_fffffffffffffc97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  bool local_2f9;
  char *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  Properties *in_stack_fffffffffffffd70;
  allocator local_281;
  string local_280 [32];
  string *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  Properties *in_stack_fffffffffffffdb0;
  string local_230 [32];
  string local_210 [32];
  char *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe20;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  char in_stack_fffffffffffffe57;
  string *in_stack_fffffffffffffe58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe60;
  string local_198 [32];
  string local_178 [32];
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  byte bVar9;
  Properties *in_stack_fffffffffffffeb0;
  long local_130;
  string local_120 [8];
  char *in_stack_fffffffffffffee8;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  Properties *in_stack_ffffffffffffff00;
  int local_e0;
  int local_dc;
  string local_b8 [32];
  string local_98 [32];
  ulong local_78;
  byte local_6d;
  allocator local_59;
  string local_58 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  byte local_19;
  char *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x174527);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,local_10,&local_59);
  gutil::split(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe57,
               (bool)in_stack_fffffffffffffe56);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_6d = 0;
  for (local_78 = 1; uVar1 = local_78,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_38), uVar1 < sVar3; local_78 = local_78 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_38,local_78);
    iVar2 = std::__cxx11::string::compare((ulong)pvVar4,0,(char *)0x2);
    if (iVar2 == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,local_78);
      std::__cxx11::string::substr((ulong)local_98,(ulong)pvVar4);
      std::__cxx11::string::c_str();
      gutil::Properties::load
                (in_stack_fffffffffffffeb0,
                 (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      std::__cxx11::string::~string(local_98);
      local_6d = 1;
    }
  }
  if ((local_6d & 1) == 0) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_38,0);
    std::__cxx11::string::string(local_b8,(string *)pvVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1747b4);
    getPrefixAlternatives
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_38);
    local_dc = (int)sVar3;
    while (local_dc = local_dc + -1, -1 < local_dc) {
      for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,(long)local_dc);
        std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
        std::__cxx11::string::c_str();
        gutil::Properties::load
                  (in_stack_fffffffffffffeb0,
                   (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
        if ((local_19 & 1) != 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Using parameter file: ");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_38,(long)local_dc);
          std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
          poVar5 = std::operator<<(poVar5,local_120);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_120);
        }
      }
    }
    local_130 = std::__cxx11::string::find_last_of((char *)local_b8,0x1ae50b);
    if (local_130 == -1) {
      local_130 = 0;
    }
    else {
      local_130 = local_130 + 1;
    }
    lVar6 = std::__cxx11::string::size();
    bVar9 = 0;
    local_2f9 = false;
    if (8 < (ulong)(lVar6 - local_130)) {
      std::__cxx11::string::substr((ulong)&stack0xfffffffffffffeb0,(ulong)local_b8);
      bVar9 = 1;
      local_2f9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                                  in_stack_fffffffffffffc88);
    }
    if ((bVar9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
    }
    if (local_2f9 != false) {
      std::__cxx11::string::substr((ulong)local_198,(ulong)local_b8);
      std::operator+(in_stack_fffffffffffffc98,
                     (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
      std::__cxx11::string::~string(local_198);
      gutil::Properties::Properties((Properties *)0x174b59);
      std::__cxx11::string::c_str();
      gutil::Properties::load
                (in_stack_fffffffffffffeb0,(char *)CONCAT17(bVar9,in_stack_fffffffffffffea8));
      if ((local_19 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Using Middlebury calibration file: ");
        poVar5 = std::operator<<(poVar5,local_178);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      gutil::Properties::getString
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd58);
      gutil::Properties::putString
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      gutil::Properties::getString
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd58);
      gutil::Properties::putString
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      gmath::SMatrix<double,_3,_3>::SMatrix((SMatrix<double,_3,_3> *)(local_230 + 0x20));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffdb0,"cam",(allocator *)&stack0xfffffffffffffdaf);
      std::__cxx11::string::operator[]((ulong)local_b8);
      std::operator+(in_stack_fffffffffffffc98,in_stack_fffffffffffffc97);
      std::__cxx11::string::c_str();
      gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdaf);
      gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
                ((Properties *)
                 CONCAT17(in_stack_fffffffffffffe57,
                          CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                 in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      gmath::SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(local_230 + 0x20),0,0);
      gutil::Properties::putValue<double>
                ((Properties *)
                 CONCAT17(in_stack_fffffffffffffe57,
                          CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                 in_stack_fffffffffffffe48,(double *)in_stack_fffffffffffffe40);
      gutil::Properties::getValue<double>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      gutil::Properties::putValue<double>
                ((Properties *)
                 CONCAT17(in_stack_fffffffffffffe57,
                          CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                 in_stack_fffffffffffffe48,(double *)in_stack_fffffffffffffe40);
      gutil::Properties::getString
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd58);
      gutil::Properties::putString
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"[1 0 0; 0 1 0; 0 0 1]",&local_281);
      gutil::Properties::putString
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      gmath::SVector<double,_3>::SVector((SVector<double,_3> *)&stack0xfffffffffffffd60);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_b8);
      in_stack_fffffffffffffca0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((double)in_stack_fffffffffffffda0 * (double)(*pcVar7 + -0x30));
      pdVar8 = gmath::SVector<double,_3>::operator[]
                         ((SVector<double,_3> *)&stack0xfffffffffffffd60,0);
      *pdVar8 = (double)in_stack_fffffffffffffca0;
      gutil::Properties::putValue<gmath::SVector<double,3>>
                ((Properties *)
                 CONCAT17(in_stack_fffffffffffffe57,
                          CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                 in_stack_fffffffffffffe48,(SVector<double,_3> *)in_stack_fffffffffffffe40);
      gutil::Properties::~Properties((Properties *)0x174fc3);
      std::__cxx11::string::~string(local_178);
    }
    std::__cxx11::string::~string(local_b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffca0);
  return;
}

Assistant:

void loadViewProperties(gutil::Properties &prop, const char *name, const char *spath,
                        bool verbose)
{
  std::vector<std::string> list;

  // load parameter files as specified in name

  gutil::split(list, name, ',');

  bool expl=false;

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "p=") == 0)
    {
      prop.load(list[i].substr(2).c_str());
      expl=true;
    }
  }

  // alternatively, search for parameter files

  if (!expl)
  {
    std::string depthname=list[0];
    const char *suffix[]= {".txt", ".TXT", "_param.txt", "_PARAM.TXT"};

    list.clear();
    getPrefixAlternatives(list, depthname, spath);

    for (int i=static_cast<int>(list.size())-1; i>=0; i--)
    {
      for (int k=0; k<4; k++)
      {
        // try all possibilities and add parameters

        try
        {
          prop.load((list[i]+suffix[k]).c_str());

          if (verbose)
          {
            std::cout << "Using parameter file: " << list[i]+suffix[k] << std::endl;
          }
        }
        catch (const gutil::Exception &)
        { }
      }
    }

    // support format of Middlebury stereo benchmark data sets

    size_t pos;

    pos=depthname.find_last_of("/\\");

    if (pos == depthname.npos)
    {
      pos=0;
    }
    else
    {
      pos++;
    }

    if (depthname.size()-pos >= 9 && depthname.substr(pos, 4) == "disp")
    {
      try
      {
        std::string s=depthname.substr(0, pos)+"calib.txt";
        gutil::Properties mprop;
        mprop.load(s.c_str());

        if (verbose)
        {
          std::cout << "Using Middlebury calibration file: " << s << std::endl;
        }

        mprop.getString("width", s, "0");
        prop.putString("camera.width", s);
        mprop.getString("height", s, "0");
        prop.putString("camera.height", s);

        gmath::Matrix33d A;
        mprop.getValue((std::string("cam")+depthname[pos+4]).c_str(), A);
        prop.putValue("camera.A", A);

        prop.putValue("f", A(0, 0));

        double t;
        mprop.getValue("baseline", t);
        prop.putValue("t", t);

        mprop.getString("doffs", s, "0");
        prop.putString("disp.offset", s);

        prop.putString("camera.R", "[1 0 0; 0 1 0; 0 0 1]");

        gmath::Vector3d T;
        T[0]=t*(depthname[pos+4]-'0');
        prop.putValue("camera.T", T);
      }
      catch (const gutil::IOException &)
      { }
      catch (const gutil::Exception &ex)
      {
        std::cerr << ex.what() << std::endl;
      }
    }
  }
}